

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

void __thiscall cfd::CoinSelectionOption::InitializeTxSizeInfo(CoinSelectionOption *this)

{
  uint32_t uVar1;
  TxOut txout;
  TxOutReference txout_ref;
  Script local_78;
  Script wpkh_script;
  
  std::__cxx11::string::string
            ((string *)&txout,"0014ffffffffffffffffffffffffffffffffffffffff",(allocator *)&txout_ref
            );
  core::Script::Script(&wpkh_script,(string *)&txout);
  std::__cxx11::string::~string((string *)&txout);
  core::Amount::Amount((Amount *)&txout_ref);
  core::TxOut::TxOut(&txout,(Amount *)&txout_ref,&wpkh_script);
  core::TxOutReference::TxOutReference(&txout_ref,&txout);
  uVar1 = core::AbstractTxOutReference::GetSerializeVsize(&txout_ref.super_AbstractTxOutReference);
  this->change_output_size_ = uVar1;
  core::Script::Script(&local_78);
  uVar1 = core::TxIn::EstimateTxInVsize(kP2wpkhAddress,&local_78,(Script *)0x0);
  this->change_spend_size_ = uVar1;
  core::Script::~Script(&local_78);
  core::AbstractTxOutReference::~AbstractTxOutReference(&txout_ref.super_AbstractTxOutReference);
  core::AbstractTxOut::~AbstractTxOut(&txout.super_AbstractTxOut);
  core::Script::~Script(&wpkh_script);
  return;
}

Assistant:

void CoinSelectionOption::InitializeTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  TxOut txout(Amount(), wpkh_script);
  TxOutReference txout_ref(txout);
  change_output_size_ = txout_ref.GetSerializeVsize();
  change_spend_size_ =
      TxIn::EstimateTxInVsize(AddressType::kP2wpkhAddress, Script());
}